

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O2

bool DynamicProfileStorage::LoadCacheCatalog(void)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  int32 iVar4;
  undefined4 *puVar5;
  uint uVar6;
  char16 *local_88;
  char16 *url;
  StorageInfo newInfo;
  StorageInfo *pSStack_68;
  DWORD len;
  StorageInfo *oldInfo;
  DWORD magic;
  DWORD version;
  DynamicProfileStorageReaderWriter catalogFile;
  uint local_38;
  uint local_34;
  DWORD time;
  DWORD count;
  
  if (!enabled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x380,"(enabled)","enabled");
    if (!bVar2) goto LAB_00891999;
    *puVar5 = 0;
  }
  if (useCacheDir == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x381,"(useCacheDir)","useCacheDir");
    if (!bVar2) goto LAB_00891999;
    *puVar5 = 0;
  }
  if (locked == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x382,"(locked)","locked");
    if (!bVar2) goto LAB_00891999;
    *puVar5 = 0;
  }
  _magic = (char16 *)0x0;
  catalogFile.filename = (char16 *)0x0;
  bVar2 = DynamicProfileStorageReaderWriter::Init
                    ((DynamicProfileStorageReaderWriter *)&magic,catalogFilename,L"rb",false,
                     (errno_t *)0x0);
  if (bVar2) {
    bVar2 = DynamicProfileStorageReaderWriter::Read<unsigned_int>
                      ((DynamicProfileStorageReaderWriter *)&magic,(uint *)&oldInfo);
    if ((((bVar2) &&
         (bVar2 = DynamicProfileStorageReaderWriter::Read<unsigned_int>
                            ((DynamicProfileStorageReaderWriter *)&magic,
                             (uint *)((long)&oldInfo + 4)), bVar2)) &&
        (bVar2 = DynamicProfileStorageReaderWriter::Read<unsigned_int>
                           ((DynamicProfileStorageReaderWriter *)&magic,&local_38), bVar2)) &&
       (bVar2 = DynamicProfileStorageReaderWriter::Read<unsigned_int>
                          ((DynamicProfileStorageReaderWriter *)&magic,&local_34),
       1 < oldInfo._4_4_ && ((int)oldInfo == 0x132b5ae && bVar2))) {
      if (2 < oldInfo._4_4_) {
        DisableCacheDir();
        Output::Print(L"ERROR: DynamicProfileStorage: Existing cache catalog has a newer format.\n")
        ;
        Output::Flush();
        bVar2 = false;
        goto LAB_008915f0;
      }
      if (useCacheDir == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                           ,0x3a8,"(useCacheDir)","useCacheDir");
        if (!bVar2) goto LAB_00891999;
        *puVar5 = 0;
      }
      if (creationTime == (ulong)local_38) {
        uVar6 = infoMap.count - infoMap.freeCount;
        if (local_34 < uVar6) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                             ,0x3ad,"(count >= start)","count >= start");
          if (!bVar2) goto LAB_00891999;
          *puVar5 = 0;
        }
        iVar4 = DynamicProfileStorageReaderWriter::Size((DynamicProfileStorageReaderWriter *)&magic)
        ;
        if (iVar4 < lastOffset) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                             ,0x3ae,"(catalogFile.Size() >= lastOffset)",
                             "catalogFile.Size() >= lastOffset");
          if (!bVar2) goto LAB_00891999;
          *puVar5 = 0;
        }
        if (local_34 == nextFileId) {
          iVar4 = DynamicProfileStorageReaderWriter::Size
                            ((DynamicProfileStorageReaderWriter *)&magic);
          bVar2 = true;
          if (iVar4 != lastOffset) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                               ,0x3b1,"(catalogFile.Size() == lastOffset)",
                               "catalogFile.Size() == lastOffset");
            if (!bVar3) {
LAB_00891999:
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar5 = 0;
          }
          goto LAB_008915f0;
        }
        bVar2 = DynamicProfileStorageReaderWriter::Seek
                          ((DynamicProfileStorageReaderWriter *)&magic,lastOffset);
        if (!bVar2) {
          DynamicProfileStorageReaderWriter::Close
                    ((DynamicProfileStorageReaderWriter *)&magic,false);
          Output::Print(L"ERROR: DynamicProfileStorage: Unable to seek to last known offset\n");
          Output::Flush();
          bVar2 = CreateCacheCatalog();
          goto LAB_008915f0;
        }
      }
      else if (creationTime == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = 0;
        Output::Print(L"WARNING: DynamicProfileStorage: Reloading full catalog\n");
        Output::Flush();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      for (; uVar6 < local_34; uVar6 = uVar6 + 1) {
        bVar2 = DynamicProfileStorageReaderWriter::ReadUtf8String
                          ((DynamicProfileStorageReaderWriter *)&magic,&local_88,
                           (DWORD *)((long)&newInfo.field_1 + 4));
        if (!bVar2) {
          bVar2 = DoTrace();
          if (bVar2) {
            Output::Print(
                         L"TRACE: DynamicProfileStorage: Cache dir catalog file corrupted: \'%s\'\n"
                         );
            Output::Flush();
          }
          DynamicProfileStorageReaderWriter::Close
                    ((DynamicProfileStorageReaderWriter *)&magic,false);
          bVar2 = CreateCacheCatalog();
          goto LAB_008915f0;
        }
        bVar2 = JsUtil::
                BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
                ::TryGetReference<char16_t*>
                          ((BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
                            *)&infoMap,&local_88,&stack0xffffffffffffff98);
        if (bVar2) {
          if (pSStack_68->isFileStorage == false) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                               ,0x3d8,"(oldInfo->isFileStorage)","oldInfo->isFileStorage");
            if (!bVar2) goto LAB_00891999;
            *puVar5 = 0;
          }
          (pSStack_68->field_1).fileId = uVar6;
        }
        else {
          url._0_1_ = 1;
          newInfo._0_4_ = uVar6;
          JsUtil::
          BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                    ((BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
                      *)&infoMap,&local_88,(StorageInfo *)&url);
        }
      }
      if ((creationTime == 0) && (bVar2 = DoTrace(), bVar2)) {
        Output::Print(L"TRACE: DynamicProfileStorage: Cache directory catalog loaded: \'%s\'\n",
                      catalogFilename);
        Output::Flush();
      }
      nextFileId = local_34;
      creationTime = (TimeType)local_38;
      lastOffset = DynamicProfileStorageReaderWriter::Size
                             ((DynamicProfileStorageReaderWriter *)&magic);
      bVar2 = true;
      goto LAB_008915f0;
    }
    DynamicProfileStorageReaderWriter::Close((DynamicProfileStorageReaderWriter *)&magic,false);
    bVar2 = DoTrace();
    if (bVar2) {
      Output::Print(L"TRACE: DynamicProfileStorage: Overwriting file for cache directory catalog: \'%s\'\n"
                    ,catalogFilename);
      Output::Flush();
    }
  }
  bVar2 = CreateCacheCatalog();
LAB_008915f0:
  DynamicProfileStorageReaderWriter::~DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)&magic);
  return bVar2;
}

Assistant:

bool DynamicProfileStorage::LoadCacheCatalog()
{
    AssertOrFailFast(enabled);
    AssertOrFailFast(useCacheDir);
    AssertOrFailFast(locked);
    DynamicProfileStorageReaderWriter catalogFile;
    DWORD magic;
    DWORD version;
    DWORD count;
    DWORD time;
    if (!catalogFile.Init(catalogFilename, _u("rb"), false))
    {
        return CreateCacheCatalog();
    }
    if (!catalogFile.Read(&magic)
        || !catalogFile.Read(&version)
        || !catalogFile.Read(&time)
        || !catalogFile.Read(&count)
        || magic != MagicNumber
        || version < FileFormatVersion)
    {
        catalogFile.Close();
#if DBG_DUMP
        if (DynamicProfileStorage::DoTrace())
        {
            Output::Print(_u("TRACE: DynamicProfileStorage: Overwriting file for cache directory catalog: '%s'\n"), catalogFilename);
            Output::Flush();
        }
#endif
        return CreateCacheCatalog();
    }

    if (version > FileFormatVersion)
    {
        DisableCacheDir();
        Output::Print(_u("ERROR: DynamicProfileStorage: Existing cache catalog has a newer format.\n"));
        Output::Flush();
        return false;
    }

    DWORD start = 0;

    AssertOrFailFast(useCacheDir);
    if (time == creationTime)
    {
        // We can reuse existing data
        start = infoMap.Count();
        AssertOrFailFast(count >= start);
        AssertOrFailFast(catalogFile.Size() >= lastOffset);
        if (count == nextFileId)
        {
            AssertOrFailFast(catalogFile.Size() == lastOffset);
            return true;
        }

        if (!catalogFile.Seek(lastOffset))
        {
            catalogFile.Close();
            Output::Print(_u("ERROR: DynamicProfileStorage: Unable to seek to last known offset\n"));
            Output::Flush();
            return CreateCacheCatalog();
        }
    }
    else if (creationTime != 0)
    {
        Output::Print(_u("WARNING: DynamicProfileStorage: Reloading full catalog\n"));
        Output::Flush();
    }

    for (DWORD i = start; i < count; i++)
    {
        DWORD len;
        char16 * url;
        if (!catalogFile.ReadUtf8String(&url, &len))
        {
#if DBG_DUMP
            if (DynamicProfileStorage::DoTrace())
            {
                Output::Print(_u("TRACE: DynamicProfileStorage: Cache dir catalog file corrupted: '%s'\n"), catalogFilename);
                Output::Flush();
            }
#endif
            // REVIEW: the file is corrupted, should we not flush the cache totally?
            catalogFile.Close();
            return CreateCacheCatalog();
        }

        StorageInfo * oldInfo;
        if (infoMap.TryGetReference(url, &oldInfo))
        {
            AssertOrFailFast(oldInfo->isFileStorage);
            oldInfo->fileId = i;
        }
        else
        {
            StorageInfo newInfo;
            newInfo.isFileStorage = true;
            newInfo.fileId = i;
            infoMap.Add(url, newInfo);
        }
    }

#if DBG_DUMP
    if (creationTime == 0 && DynamicProfileStorage::DoTrace())
    {
        Output::Print(_u("TRACE: DynamicProfileStorage: Cache directory catalog loaded: '%s'\n"), catalogFilename);
        Output::Flush();
    }
#endif

    nextFileId = count;
    creationTime = time;
    lastOffset = catalogFile.Size();
    return true;
}